

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O2

void __thiscall
slang::FormatBuffer::format<int&,int&>
          (FormatBuffer *this,format_string<int_&,_int_&> fmt,int *args,int *args_1)

{
  format_args args_00;
  int local_28 [4];
  int local_18;
  
  local_28[0] = *args;
  local_18 = *args_1;
  args_00.field_1.values_ = (value<fmt::v11::context> *)local_28;
  args_00.desc_ = 0x11;
  ::fmt::v11::detail::vformat_to((buffer<char> *)this,fmt.str,args_00,(locale_ref)0x0);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }